

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_connect_client(char *host,int port,int use_ssl,char *error_buffer,size_t error_buffer_size)

{
  mg_connection *pmVar1;
  undefined1 local_80 [8];
  mg_error_data error;
  mg_init_data init;
  mg_client_options opts;
  size_t error_buffer_size_local;
  char *error_buffer_local;
  int use_ssl_local;
  int port_local;
  char *host_local;
  
  memset(&error.text_buffer_size,0,0x18);
  memset(local_80,0,0x18);
  error._0_8_ = error_buffer;
  error.text = (char *)error_buffer_size;
  memset(&init.configuration_options,0,0x28);
  init.configuration_options = (char **)host;
  pmVar1 = mg_connect_client_impl
                     ((mg_client_options *)&init.configuration_options,use_ssl,
                      (mg_init_data *)&error.text_buffer_size,(mg_error_data *)local_80);
  return pmVar1;
}

Assistant:

mg_connection *
mg_connect_client(const char *host,
                  int port,
                  int use_ssl,
                  char *error_buffer,
                  size_t error_buffer_size)
{
	struct mg_client_options opts;
	struct mg_init_data init;
	struct mg_error_data error;

	memset(&init, 0, sizeof(init));

	memset(&error, 0, sizeof(error));
	error.text_buffer_size = error_buffer_size;
	error.text = error_buffer;

	memset(&opts, 0, sizeof(opts));
	opts.host = host;
	opts.port = port;
	if (use_ssl) {
		opts.host_name = host;
	}

	return mg_connect_client_impl(&opts, use_ssl, &init, &error);
}